

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O2

void __thiscall
highs::RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>::deleteFixup
          (RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *this,LinkType x,
          LinkType nilParent)

{
  byte *pbVar1;
  uint *puVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int *piVar6;
  long lVar7;
  int x_00;
  long lVar8;
  ulong uVar9;
  long lVar10;
  LinkType x_01;
  uint uVar11;
  ulong uVar12;
  
  while (x != *this->rootNode) {
    lVar4 = *(long *)this[2].rootNode;
    x_01 = nilParent;
    if (x != -1) {
      uVar11 = *(uint *)(lVar4 + 0x18 + (long)x * 0x20);
      if ((int)uVar11 < 0) goto LAB_002aab06;
      x_01 = uVar11 - 1;
    }
    lVar10 = (long)x_01 * 0x20;
    iVar3 = *(int *)(lVar4 + 0x10 + lVar10);
    uVar12 = (ulong)(x == iVar3);
    x_00 = *(int *)(lVar4 + lVar10 + 0x10 + uVar12 * 4);
    if ((long)x_00 == -1) {
      x_00 = -1;
    }
    else {
      lVar5 = (long)x_00 * 0x20;
      uVar11 = *(uint *)(lVar4 + 0x18 + lVar5);
      if ((int)uVar11 < 0) {
        *(uint *)(lVar4 + lVar5 + 0x18) = uVar11 & 0x7fffffff;
        pbVar1 = (byte *)(lVar4 + 0x1b + lVar10);
        *pbVar1 = *pbVar1 | 0x80;
        rotate(this,x_01,(uint)(x != iVar3));
        lVar4 = *(long *)this[2].rootNode;
        x_00 = *(LinkType *)(lVar4 + lVar10 + 0x10 + uVar12 * 4);
      }
    }
    lVar7 = (long)x_00;
    lVar5 = lVar7 * 0x20;
    piVar6 = (int *)(lVar4 + lVar5 + 0x10);
    if ((((long)*piVar6 == -1) || (-1 < *(int *)(lVar4 + 0x18 + (long)*piVar6 * 0x20))) &&
       ((lVar8 = (long)*(int *)(lVar4 + lVar5 + 0x14), lVar8 == -1 ||
        (-1 < *(int *)(lVar4 + 0x18 + lVar8 * 0x20))))) {
      pbVar1 = (byte *)(lVar4 + 0x1b + lVar5);
      *pbVar1 = *pbVar1 | 0x80;
      x = x_01;
    }
    else {
      if (((long)piVar6[uVar12] == -1) ||
         (-1 < *(int *)(lVar4 + 0x18 + (long)piVar6[uVar12] * 0x20))) {
        uVar9 = (ulong)(x != iVar3);
        puVar2 = (uint *)(lVar4 + 0x18 + (long)piVar6[uVar9] * 0x20);
        *puVar2 = *puVar2 & 0x7fffffff;
        pbVar1 = (byte *)(lVar4 + 0x1b + lVar5);
        *pbVar1 = *pbVar1 | 0x80;
        rotate(this,x_00,(uint)(x == iVar3));
        lVar4 = *(long *)this[2].rootNode;
        x_00 = *(int *)(lVar4 + lVar10 + 0x10 + uVar12 * 4);
        lVar7 = (long)x_00;
      }
      else {
        uVar9 = (ulong)(x != iVar3);
      }
      setColor(this,x_00,*(uint *)(lVar4 + 0x18 + lVar10) >> 0x1f);
      lVar4 = *(long *)this[2].rootNode;
      puVar2 = (uint *)(lVar4 + 0x18 + lVar10);
      *puVar2 = *puVar2 & 0x7fffffff;
      puVar2 = (uint *)(lVar4 + 0x18 +
                       (long)*(int *)(lVar7 * 0x20 + lVar4 + 0x10 + uVar12 * 4) * 0x20);
      *puVar2 = *puVar2 & 0x7fffffff;
      rotate(this,x_01,(Dir)uVar9);
      x = *this->rootNode;
    }
  }
  if (x != -1) {
    lVar4 = *(long *)this[2].rootNode;
    uVar11 = *(uint *)(lVar4 + 0x18 + (long)x * 0x20);
LAB_002aab06:
    *(uint *)(lVar4 + 0x18 + (long)x * 0x20) = uVar11 & 0x7fffffff;
  }
  return;
}

Assistant:

void deleteFixup(LinkType x, const LinkType nilParent) {
    while (x != rootNode && isBlack(x)) {
      Dir dir;

      LinkType p = x == kNoLink ? nilParent : getParent(x);
      dir = Dir(x == getChild(p, kLeft));
      LinkType w = getChild(p, dir);
      assert(w != kNoLink);

      if (isRed(w)) {
        makeBlack(w);
        makeRed(p);
        rotate(p, opposite(dir));
        assert((x == kNoLink && p == nilParent) ||
               (x != kNoLink && p == getParent(x)));
        w = getChild(p, dir);
        assert(w != kNoLink);
      }

      if (isBlack(getChild(w, kLeft)) && isBlack(getChild(w, kRight))) {
        makeRed(w);
        x = p;
      } else {
        if (isBlack(getChild(w, dir))) {
          makeBlack(getChild(w, opposite(dir)));
          makeRed(w);
          rotate(w, dir);
          assert((x == kNoLink && p == nilParent) ||
                 (x != kNoLink && p == getParent(x)));
          w = getChild(p, dir);
        }
        setColor(w, getColor(p));
        makeBlack(p);
        makeBlack(getChild(w, dir));
        rotate(p, opposite(dir));
        x = rootNode;
      }
    }

    if (x != kNoLink) makeBlack(x);
  }